

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::BindSampler(GLContextState *this,Uint32 Index,GLSamplerObj *GLSampler)

{
  bool bVar1;
  pointer piVar2;
  ulong uVar3;
  Uint32 Index_local;
  GLenum err;
  GLuint GLSamplerHandle;
  string msg;
  
  uVar3 = (ulong)Index;
  piVar2 = (this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  Index_local = Index;
  if ((ulong)((long)(this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar3) {
    msg._M_dataplus._M_p._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_BoundSamplers,uVar3 + 1,(value_type_conflict4 *)&msg);
    piVar2 = (this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  GLSamplerHandle = 0;
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLSamplerCreateReleaseHelper>>
                    (piVar2 + uVar3,GLSampler,&GLSamplerHandle);
  if (bVar1) {
    (*__glewBindSampler)(Index_local,GLSamplerHandle);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[32],unsigned_int,char[17],unsigned_int>
                (false,"BindSampler",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x103,(char (*) [32])"Failed to bind sampler to slot ",&Index_local,
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "BindSampler",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x103);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void GLContextState::BindSampler(Uint32 Index, const GLObjectWrappers::GLSamplerObj& GLSampler)
{
    if (static_cast<size_t>(Index) >= m_BoundSamplers.size())
        m_BoundSamplers.resize(size_t{Index} + 1, -1);

    GLuint GLSamplerHandle = 0;
    if (UpdateBoundObject(m_BoundSamplers[Index], GLSampler, GLSamplerHandle))
    {
        glBindSampler(Index, GLSamplerHandle);
        DEV_CHECK_GL_ERROR("Failed to bind sampler to slot ", Index);
    }
}